

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_ai.cpp
# Opt level: O0

void __thiscall cpp_client::Base_ai::invalid(Base_ai *this,string *message)

{
  ostream *poVar1;
  string *message_local;
  Base_ai *this_local;
  
  poVar1 = ::operator<<((ostream *)&std::cerr,text_yellow);
  poVar1 = std::operator<<(poVar1,"Invalid: ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  poVar1 = ::operator<<(poVar1,normal);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void Base_ai::invalid(const std::string& message)
{
   std::cerr << sgr::text_yellow << "Invalid: " << message << sgr::reset << '\n';
}